

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::
statement<char_const(&)[25],char_const*&,char_const(&)[2],char_const*&,char_const(&)[10],char_const*&,char_const(&)[3],char_const*&,char_const(&)[10],char_const*&,char_const(&)[2]>
          (CompilerGLSL *this,char (*ts) [25],char **ts_1,char (*ts_2) [2],char **ts_3,
          char (*ts_4) [10],char **ts_5,char (*ts_6) [3],char **ts_7,char (*ts_8) [10],char **ts_9,
          char (*ts_10) [2])

{
  StringStream<4096UL,_4096UL> *this_00;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_01;
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  uint uVar4;
  string local_50;
  
  bVar2 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (!bVar2) {
    this_01 = this->redirect_statement;
    if (this_01 ==
        (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
         *)0x0) {
      if (this->indent != 0) {
        uVar4 = 0;
        do {
          StringStream<4096UL,_4096UL>::append(&this->buffer,"    ",4);
          uVar4 = uVar4 + 1;
        } while (uVar4 < this->indent);
      }
      this_00 = &this->buffer;
      sVar3 = strlen(*ts);
      StringStream<4096UL,_4096UL>::append(this_00,*ts,sVar3);
      this->statement_count = this->statement_count + 1;
      pcVar1 = *ts_1;
      sVar3 = strlen(pcVar1);
      StringStream<4096UL,_4096UL>::append(this_00,pcVar1,sVar3);
      this->statement_count = this->statement_count + 1;
      sVar3 = strlen(*ts_2);
      StringStream<4096UL,_4096UL>::append(this_00,*ts_2,sVar3);
      this->statement_count = this->statement_count + 1;
      pcVar1 = *ts_3;
      sVar3 = strlen(pcVar1);
      StringStream<4096UL,_4096UL>::append(this_00,pcVar1,sVar3);
      this->statement_count = this->statement_count + 1;
      sVar3 = strlen(*ts_4);
      StringStream<4096UL,_4096UL>::append(this_00,*ts_4,sVar3);
      this->statement_count = this->statement_count + 1;
      statement_inner<char_const*&,char_const(&)[3],char_const*&,char_const(&)[10],char_const*&,char_const(&)[2]>
                (this,ts_5,ts_6,ts_7,ts_8,ts_9,ts_10);
      local_50._M_dataplus._M_p._0_1_ = 10;
      StringStream<4096UL,_4096UL>::append(this_00,(char *)&local_50,1);
      return;
    }
    join<char_const(&)[25],char_const*&,char_const(&)[2],char_const*&,char_const(&)[10],char_const*&,char_const(&)[3],char_const*&,char_const(&)[10],char_const*&,char_const(&)[2]>
              (&local_50,(spirv_cross *)ts,(char (*) [25])ts_1,(char **)ts_2,(char (*) [2])ts_3,
               (char **)ts_4,(char (*) [10])ts_5,(char **)ts_6,(char (*) [3])ts_7,(char **)ts_8,
               (char (*) [10])ts_9,(char **)ts_10,ts_2);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_01,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_));
    }
  }
  this->statement_count = this->statement_count + 1;
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}